

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_list.c
# Opt level: O0

_Bool adt_list_remove(adt_list_t *self,void *pItem)

{
  adt_list_elem_t *pIter;
  adt_list_elem_t *iter;
  void *pItem_local;
  adt_list_t *self_local;
  
  if (self == (adt_list_t *)0x0) {
    self_local._7_1_ = false;
  }
  else {
    pIter = adt_list_find(self,pItem);
    if (pIter == (adt_list_elem_t *)0x0) {
      self_local._7_1_ = false;
    }
    else {
      adt_list_erase(self,pIter);
      self_local._7_1_ = true;
    }
  }
  return self_local._7_1_;
}

Assistant:

bool adt_list_remove(adt_list_t *self, void *pItem)
{
   if (self != 0)
   {
      adt_list_elem_t *iter = adt_list_find(self, pItem);
      if (iter == 0)
      {
         return false;
      }
      else
      {
         adt_list_erase(self, iter);
         return true;
      }
   }
   return false;
}